

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.c
# Opt level: O2

int compressor_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  compressor_segment_data *data;
  code *pcVar1;
  
  data = (compressor_segment_data *)segment->data;
  switch(field) {
  case 0x29:
    data->wet = *value;
    break;
  case 0x2a:
  case 0x2b:
switchD_00133bba_caseD_2a:
    mixed_err(7);
    return 0;
  case 0x2c:
    data->pregain = *value;
    break;
  case 0x2d:
    data->threshold = *value;
    break;
  case 0x2e:
    data->knee = *value;
    break;
  case 0x2f:
    data->ratio = *value;
    break;
  case 0x30:
    data->attack = *value;
    break;
  case 0x31:
    data->release = *value;
    break;
  case 0x32:
    data->predelay = *value;
    break;
  case 0x33:
    data->releasezone[0] = *value;
    data->releasezone[1] = *(float *)((long)value + 4);
    data->releasezone[2] = *(float *)((long)value + 8);
    data->releasezone[3] = *(float *)((long)value + 0xc);
    break;
  case 0x34:
    data->postgain = *value;
    break;
  default:
    if (field != 1) goto switchD_00133bba_caseD_2a;
    if (*value == '\x01') {
      pcVar1 = compressor_segment_mix_bypass;
    }
    else {
      pcVar1 = (code *)&LAB_001050e0;
    }
    segment->mix = pcVar1;
  }
  compressor_reinit(data);
  return 1;
}

Assistant:

int compressor_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct compressor_segment_data *data = (struct compressor_segment_data *)segment->data;
  switch(field){
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = compressor_segment_mix_bypass;
    }else{
      segment->mix = compressor_segment_mix;
    }
    break;
  case MIXED_COMPRESSOR_PREGAIN: data->pregain = *(float *)value; break;
  case MIXED_COMPRESSOR_THRESHOLD: data->threshold = *(float *)value; break;
  case MIXED_COMPRESSOR_KNEE: data->knee = *(float *)value; break;
  case MIXED_COMPRESSOR_RATIO: data->ratio = *(float *)value; break;
  case MIXED_COMPRESSOR_ATTACK: data->attack = *(float *)value; break;
  case MIXED_COMPRESSOR_RELEASE: data->release = *(float *)value; break;
  case MIXED_COMPRESSOR_PREDELAY: data->predelay = *(float *)value; break;
  case MIXED_COMPRESSOR_POSTGAIN: data->postgain = *(float *)value; break;
  case MIXED_MIX: data->wet = *(float *)value; break;
  case MIXED_COMPRESSOR_RELEASEZONE: {
    float *parts = (float *)value;
    data->releasezone[0] = parts[0];
    data->releasezone[1] = parts[1];
    data->releasezone[2] = parts[2];
    data->releasezone[3] = parts[3];
  } break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  compressor_reinit(data);
  return 1;
}